

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

int __thiscall kj::anon_unknown_8::DiskHandle::stat(DiskHandle *this,char *__file,stat *__buf)

{
  int iVar1;
  Type TVar2;
  Fault f;
  stat stats;
  Fault local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  stat local_b0;
  
  do {
    iVar1 = fstat(*(int *)__file,&local_b0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    TVar2 = modeToType(local_b0.st_mode);
    (this->fd).fd = TVar2;
    this[1].fd.fd = (undefined4)local_b0.st_size;
    this[1].fd.unwindDetector = (UnwindDetector)local_b0.st_size._4_4_;
    this[2].fd = (AutoCloseFd)(local_b0.st_blocks << 9);
    this[3].fd = (AutoCloseFd)(local_b0.st_mtim.tv_sec * 1000000000 + local_b0.st_mtim.tv_nsec);
    this[4].fd.fd = (int)local_b0.st_nlink;
    this[5].fd = (AutoCloseFd)
                 ((local_b0.st_dev << 0x20 | local_b0.st_dev >> 0x20) ^ local_b0.st_ino);
    return (int)this;
  }
  local_d0.exception = (Exception *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  _::Debug::Fault::init
            (&local_d0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  _::Debug::Fault::fatal(&local_d0);
}

Assistant:

FsNode::Metadata stat() const {
    struct stat stats;
    KJ_SYSCALL(::fstat(fd, &stats));
    return statToMetadata(stats);
  }